

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double logistic_cdf_inv(double cdf,double a,double b)

{
  double dVar1;
  
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    dVar1 = log((1.0 - cdf) / cdf);
    return a - b * dVar1;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"LOGISTIC_CDF_INV - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
  exit(1);
}

Assistant:

double logistic_cdf_inv ( double cdf, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    LOGISTIC_CDF_INV inverts the Logistic CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//    0.0 <= CDF <= 1.0.
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < B.
//
//    Output, double LOGISTIC_CDF_INV, the corresponding argument.
//
{
  double x;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << " \n";
    cerr << "LOGISTIC_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  x = a - b * log ( ( 1.0 - cdf ) / cdf );

  return x;
}